

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx11.cc
# Opt level: O0

void do_inttypes(void)

{
  longlong x;
  
  check_size<signed_char>(1,true);
  check_size<unsigned_char>(1,false);
  check_size<short>(2,true);
  check_size<unsigned_short>(2,false);
  check_size<int>(4,true);
  check_size<unsigned_int>(4,false);
  check_size<long>(8,true);
  check_size<unsigned_long>(8,false);
  check_size<long_long>(8,true);
  return;
}

Assistant:

void
do_inttypes()
{
    // static_assert is a compile-time check
    static_assert(1 == sizeof(int8_t), "int8_t check");
    check_size<int8_t>(1, true);
    check_size<uint8_t>(1, false);
    check_size<int16_t>(2, true);
    check_size<uint16_t>(2, false);
    check_size<int32_t>(4, true);
    check_size<uint32_t>(4, false);
    check_size<int64_t>(8, true);
    check_size<uint64_t>(8, false);

    // auto, decltype
    auto x = 5LL;
    check_size<decltype(x)>(8, true);
    assert((std::is_same<long long, decltype(x)>::value));
}